

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
         *this)

{
  FloatFormat *samplings;
  StatementP *value;
  ostringstream *poVar1;
  ostream *poVar2;
  Precision PVar3;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar4;
  TestLog *pTVar5;
  Statement *pSVar6;
  ShaderExecutor *pSVar7;
  bool bVar8;
  int iVar9;
  MessageBuilder *this_01;
  _Rb_tree_node_base *p_Var10;
  IVal *pIVar11;
  IVal *value_00;
  TestStatus *__return_storage_ptr___00;
  string *this_02;
  bool bVar12;
  int numErrors;
  FuncSet funcs;
  IVal in1;
  IVal in2;
  FloatFormat highpFmt;
  IVal in3;
  void *outputArr [2];
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_> outputs;
  void *inputArr [4];
  IVal reference0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa78;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  *pBVar13;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  *pBVar14;
  long local_570;
  int local_564;
  size_t local_560;
  long local_558;
  FloatFormat *local_550;
  undefined1 local_548 [8];
  undefined1 auStack_540 [24];
  _Rb_tree_node_base *local_528;
  double dStack_520;
  TestStatus *local_510;
  IVal local_508;
  string local_4d8;
  FloatFormat local_4b8;
  size_t local_490;
  string local_488;
  pointer local_468;
  _Base_ptr local_460;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_458;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  local_428;
  pointer local_3f8;
  pointer local_3f0;
  pointer local_3e8;
  pointer local_3e0;
  undefined1 local_3d8 [32];
  _Rb_tree_node_base *local_3b8;
  Precision PStack_3b0;
  undefined4 uStack_3ac;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_3a8;
  undefined4 local_3a0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_258;
  ResultCollector local_1f8;
  Vector<tcu::Interval,_2> local_1a8 [7];
  
  this_00 = this->m_samplings;
  samplings = &(this->m_caseCtx).floatFormat;
  PVar3 = (this->m_caseCtx).precision;
  sVar4 = (this->m_caseCtx).numRandoms;
  local_510 = __return_storage_ptr__;
  iVar9 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_550 = samplings;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_258,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)samplings,(FloatFormat *)(ulong)PVar3,(Precision)sVar4,(ulong)(iVar9 + 0xdeadbeef),
             in_stack_fffffffffffffa78);
  local_560 = (long)local_258.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_258.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>::Outputs
            (&local_428,local_560);
  local_4b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_4b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_4b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_4b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_4b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_4b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_4b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_4b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_4b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_564 = 0;
  local_458._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_458._M_impl.super__Rb_tree_header._M_header;
  local_458._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_458._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_458._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_458._M_impl.super__Rb_tree_header._M_header._M_right =
       local_458._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_3f8 = local_258.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_3f0 = local_258.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_3e8 = local_258.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_3e0 = local_258.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_468 = local_428.out0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_460 = (_Base_ptr)
              local_428.out1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  poVar1 = (ostringstream *)(local_3d8 + 8);
  local_3d8._0_8_ = pTVar5;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Statement: ");
  value = &this->m_stmt;
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_3d8,value);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  auStack_540._0_8_ = (ulong)(uint)auStack_540._4_4_ << 0x20;
  auStack_540._8_8_ = (_Base_ptr)0x0;
  dStack_520 = 0.0;
  pSVar6 = (value->super_SharedPtr<const_vkt::shaderexecutor::Statement>).m_ptr;
  auStack_540._16_8_ = (_Rb_tree_node_base *)auStack_540;
  local_528 = (_Rb_tree_node_base *)auStack_540;
  (*pSVar6->_vptr_Statement[4])(pSVar6,local_548);
  for (p_Var10 = (_Rb_tree_node_base *)auStack_540._16_8_;
      p_Var10 != (_Rb_tree_node_base *)auStack_540;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    (**(code **)(**(long **)(p_Var10 + 1) + 0x30))(*(long **)(p_Var10 + 1),local_1a8);
  }
  pBVar13 = this;
  if (dStack_520 != 0.0) {
    poVar1 = (ostringstream *)(local_3d8 + 8);
    local_3d8._0_8_ = pTVar5;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)poVar1,(string *)&local_508);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_548);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  pSVar7 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  p_Var10 = (_Rb_tree_node_base *)&local_468;
  (*pSVar7->_vptr_ShaderExecutor[2])(pSVar7,local_560,&local_3f8,p_Var10,0);
  tcu::Vector<tcu::Interval,_2>::Vector(local_1a8);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_3d8);
  tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)local_548);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_458,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_458,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_508);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_458,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4d8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_458,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_488);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_458,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_3d8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_458,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_548);
  local_558 = 0;
  local_570 = 0;
  local_490 = local_560;
  iVar9 = 0;
  while (bVar12 = local_490 != 0, local_490 = local_490 - 1, bVar12) {
    tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_1a8);
    tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)local_548);
    round<tcu::Vector<float,2>>
              (&local_508,(shaderexecutor *)local_550,
               (FloatFormat *)
               ((long)(local_258.in0.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + local_570),
               (Vector<float,_2> *)p_Var10);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_3d8,local_550,&local_508);
    pIVar11 = Environment::lookup<tcu::Vector<float,2>>
                        ((Environment *)&local_458,
                         (pBVar13->m_variables).in0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                         .m_ptr);
    pIVar11->m_data[1].m_lo = (double)local_3b8;
    pIVar11->m_data[1].m_hi = (double)CONCAT44(uStack_3ac,PStack_3b0);
    pIVar11->m_data[0].m_hi = (double)CONCAT44(local_3d8._20_4_,local_3d8._16_4_);
    *(ulong *)(pIVar11->m_data + 1) = CONCAT44(local_3d8._28_4_,local_3d8._24_4_);
    *(undefined8 *)pIVar11->m_data = local_3d8._0_8_;
    pIVar11->m_data[0].m_lo = (double)CONCAT44(local_3d8._12_4_,local_3d8._8_4_);
    pBVar14 = pBVar13;
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_458,
               (pBVar13->m_variables).in1.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_458,
               (pBVar13->m_variables).in2.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_458,
               (pBVar13->m_variables).in3.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    PStack_3b0 = (pBVar13->m_caseCtx).precision;
    p_Var10 = (_Rb_tree_node_base *)local_550->m_maxValue;
    local_3d8._0_8_ = *(undefined8 *)local_550;
    local_3d8._8_4_ = local_550->m_fractionBits;
    local_3d8._12_4_ = local_550->m_hasSubnormal;
    local_3d8._16_4_ = local_550->m_hasInf;
    local_3d8._20_4_ = local_550->m_hasNaN;
    local_3d8[0x18] = local_550->m_exactPrecision;
    local_3d8._25_3_ = *(undefined3 *)&local_550->field_0x19;
    local_3d8._28_4_ = *(undefined4 *)&local_550->field_0x1c;
    local_3a0 = 0;
    pSVar6 = (pBVar13->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    local_3b8 = p_Var10;
    local_3a8 = &local_458;
    (*pSVar6->_vptr_Statement[3])(pSVar6,(MessageBuilder *)local_3d8);
    pIVar11 = Environment::lookup<tcu::Vector<float,2>>
                        ((Environment *)&local_458,
                         (pBVar13->m_variables).out1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                         .m_ptr);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_3d8,&local_4b8,pIVar11);
    auStack_540._0_8_ = CONCAT44(local_3d8._12_4_,local_3d8._8_4_);
    auStack_540._8_8_ = CONCAT44(local_3d8._20_4_,local_3d8._16_4_);
    auStack_540._16_8_ = CONCAT44(local_3d8._28_4_,local_3d8._24_4_);
    dStack_520 = (double)CONCAT44(uStack_3ac,PStack_3b0);
    local_528 = local_3b8;
    local_548 = (undefined1  [8])local_3d8._0_8_;
    bVar12 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                       ((IVal *)local_548,
                        (Vector<float,_2> *)
                        ((long)(local_428.out1.
                                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + local_570));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3d8,"Shader output 1 is outside acceptable range",
               (allocator<char> *)&local_508);
    bVar12 = tcu::ResultCollector::check(&local_1f8,bVar12,(string *)local_3d8);
    std::__cxx11::string::~string((string *)local_3d8);
    value_00 = Environment::lookup<tcu::Matrix<float,2,2>>
                         ((Environment *)&local_458,
                          (pBVar14->m_variables).out0.
                          super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                          .m_ptr);
    ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
              ((IVal *)local_3d8,&local_4b8,value_00);
    tcu::Matrix<tcu::Interval,_2,_2>::operator=
              ((Matrix<tcu::Interval,_2,_2> *)local_1a8,(Matrix<tcu::Interval,_2,_2> *)local_3d8);
    bVar8 = ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doContains
                      ((IVal *)local_1a8,
                       (Matrix<float,_2,_2> *)
                       ((long)((local_428.out0.
                                super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data
                       + local_558));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3d8,"Shader output 0 is outside acceptable range",
               (allocator<char> *)&local_508);
    bVar8 = tcu::ResultCollector::check(&local_1f8,bVar8,(string *)local_3d8);
    std::__cxx11::string::~string((string *)local_3d8);
    if ((!bVar12 || !bVar8) && (iVar9 = iVar9 + 1, local_564 = iVar9, iVar9 < 0x65)) {
      poVar1 = (ostringstream *)(local_3d8 + 8);
      local_3d8._0_8_ = pTVar5;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Failed");
      std::operator<<((ostream *)poVar1," sample:\n");
      std::operator<<((ostream *)poVar1,"\t");
      std::__cxx11::string::string
                ((string *)&local_508,
                 (string *)
                 &((pBVar14->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                  m_ptr)->m_name);
      std::operator<<((ostream *)(local_3d8 + 8),(string *)&local_508);
      std::operator<<((ostream *)(local_3d8 + 8)," = ");
      valueToString<tcu::Vector<float,2>>
                (&local_4d8,(shaderexecutor *)&local_4b8,
                 (FloatFormat *)
                 ((long)(local_258.in0.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + local_570),
                 (Vector<float,_2> *)p_Var10);
      poVar2 = (ostream *)(local_3d8 + 8);
      std::operator<<(poVar2,(string *)&local_4d8);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_508);
      std::operator<<(poVar2,"\t");
      std::__cxx11::string::string
                ((string *)&local_508,
                 (string *)
                 &((pBVar14->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
                  m_ptr)->m_name);
      std::operator<<((ostream *)(local_3d8 + 8),(string *)&local_508);
      std::operator<<((ostream *)(local_3d8 + 8)," = ");
      valueToString<tcu::Matrix<float,2,2>>
                (&local_4d8,(shaderexecutor *)&local_4b8,
                 (FloatFormat *)
                 ((long)((local_428.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                 local_558),(Matrix<float,_2,_2> *)p_Var10);
      poVar2 = (ostream *)(local_3d8 + 8);
      std::operator<<(poVar2,(string *)&local_4d8);
      std::operator<<(poVar2,"\n");
      std::operator<<(poVar2,"\tExpected range: ");
      intervalToString<tcu::Matrix<float,2,2>>
                (&local_488,(shaderexecutor *)&local_4b8,(FloatFormat *)local_1a8,(IVal *)p_Var10);
      poVar2 = (ostream *)(local_3d8 + 8);
      std::operator<<(poVar2,(string *)&local_488);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_508);
      std::operator<<(poVar2,"\t");
      std::__cxx11::string::string
                ((string *)&local_508,
                 (string *)
                 &((pBVar14->m_variables).out1.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                  m_ptr)->m_name);
      std::operator<<((ostream *)(local_3d8 + 8),(string *)&local_508);
      std::operator<<((ostream *)(local_3d8 + 8)," = ");
      valueToString<tcu::Vector<float,2>>
                (&local_4d8,(shaderexecutor *)&local_4b8,
                 (FloatFormat *)
                 ((long)(local_428.out1.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + local_570),
                 (Vector<float,_2> *)p_Var10);
      poVar2 = (ostream *)(local_3d8 + 8);
      std::operator<<(poVar2,(string *)&local_4d8);
      std::operator<<(poVar2,"\n");
      std::operator<<(poVar2,"\tExpected range: ");
      intervalToString<tcu::Vector<float,2>>
                (&local_488,(shaderexecutor *)&local_4b8,(FloatFormat *)local_548,(IVal *)p_Var10);
      poVar2 = (ostream *)(local_3d8 + 8);
      std::operator<<(poVar2,(string *)&local_488);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_508);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
    }
    local_570 = local_570 + 8;
    local_558 = local_558 + 0x10;
    pBVar13 = pBVar14;
  }
  if (iVar9 < 0x65) {
    if (iVar9 == 0) {
      poVar1 = (ostringstream *)(local_3d8 + 8);
      local_3d8._0_8_ = pTVar5;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," inputs passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3d8,"Pass",(allocator<char> *)local_1a8);
      __return_storage_ptr___00 = local_510;
      tcu::TestStatus::pass(local_510,(string *)local_3d8);
      this_02 = (string *)local_3d8;
      goto LAB_0082734f;
    }
  }
  else {
    poVar1 = (ostringstream *)(local_3d8 + 8);
    local_3d8._0_8_ = pTVar5;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"(Skipped ");
    std::ostream::operator<<(poVar1,iVar9 + -100);
    std::operator<<((ostream *)poVar1," messages.)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  poVar1 = (ostringstream *)(local_3d8 + 8);
  local_3d8._0_8_ = pTVar5;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,iVar9);
  std::operator<<((ostream *)poVar1,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1," inputs failed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  de::toString<int>((string *)local_1a8,&local_564);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_548," test failed. Check log for the details",
             (allocator<char> *)&local_508);
  __return_storage_ptr___00 = local_510;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)local_3d8);
  std::__cxx11::string::~string((string *)local_3d8);
  std::__cxx11::string::~string((string *)local_548);
  this_02 = (string *)local_1a8;
LAB_0082734f:
  std::__cxx11::string::~string(this_02);
  tcu::ResultCollector::~ResultCollector(&local_1f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_458);
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>::
  ~Outputs(&local_428);
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::~Inputs(&local_258);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}